

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O0

int lest::select(int __nfds,fd_set *__readfds,fd_set *__writefds,fd_set *__exceptfds,
                timeval *__timeout)

{
  byte bVar1;
  bool bVar2;
  bool bVar3;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  undefined7 extraout_var_01;
  undefined8 extraout_RAX;
  undefined7 uVar6;
  reference pvVar4;
  undefined8 extraout_RAX_00;
  undefined7 extraout_var_02;
  ulong uVar5;
  undefined7 extraout_var_03;
  text *part;
  reverse_iterator pos;
  bool any;
  char *in_stack_fffffffffffffe98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffea0;
  undefined4 in_stack_fffffffffffffea8;
  undefined1 in_stack_fffffffffffffeac;
  undefined1 in_stack_fffffffffffffead;
  byte in_stack_fffffffffffffeae;
  byte in_stack_fffffffffffffeaf;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffeb0;
  undefined7 in_stack_fffffffffffffeb8;
  undefined1 in_stack_fffffffffffffebf;
  undefined6 in_stack_fffffffffffffed8;
  undefined1 in_stack_fffffffffffffedf;
  byte bVar7;
  _Alloc_hider in_stack_fffffffffffffee0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffee8;
  undefined8 in_stack_fffffffffffffef0;
  text *in_stack_ffffffffffffff60;
  byte local_1;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
  bVar1 = none((texts *)0x11061d);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(in_stack_fffffffffffffeb0);
  if ((bVar1 & 1) == 0) {
    bVar3 = false;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::rbegin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)CONCAT17(in_stack_fffffffffffffeaf,
                         CONCAT16(in_stack_fffffffffffffeae,
                                  CONCAT15(in_stack_fffffffffffffead,
                                           CONCAT14(in_stack_fffffffffffffeac,
                                                    in_stack_fffffffffffffea8)))));
    while( true ) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::rend((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)CONCAT17(in_stack_fffffffffffffeaf,
                         CONCAT16(in_stack_fffffffffffffeae,
                                  CONCAT15(in_stack_fffffffffffffead,
                                           CONCAT14(in_stack_fffffffffffffeac,
                                                    in_stack_fffffffffffffea8)))));
      bVar2 = std::
              operator==<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        ((reverse_iterator<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          *)in_stack_fffffffffffffeb0,
                         (reverse_iterator<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          *)CONCAT17(in_stack_fffffffffffffeaf,
                                     CONCAT16(in_stack_fffffffffffffeae,
                                              CONCAT15(in_stack_fffffffffffffead,
                                                       CONCAT14(in_stack_fffffffffffffeac,
                                                                in_stack_fffffffffffffea8)))));
      if (((bVar2 ^ 0xffU) & 1) == 0) break;
      std::
      reverse_iterator<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   *)in_stack_fffffffffffffea0);
      bVar3 = std::operator==(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
      uVar6 = extraout_var_00;
      if ((bVar3) ||
         (bVar3 = std::operator==(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98),
         uVar6 = extraout_var_01, bVar3)) {
        local_1 = 1;
        goto LAB_001109c9;
      }
      std::__cxx11::string::string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffee0._M_p,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffffedf,CONCAT16(bVar1,in_stack_fffffffffffffed8)));
      std::__cxx11::string::string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffee0._M_p,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffffedf,CONCAT16(bVar1,in_stack_fffffffffffffed8)));
      in_stack_fffffffffffffeaf =
           search((text *)in_stack_fffffffffffffee0._M_p,
                  (text *)CONCAT17(in_stack_fffffffffffffedf,
                                   CONCAT16(bVar1,in_stack_fffffffffffffed8)));
      std::__cxx11::string::~string(in_stack_fffffffffffffea0);
      std::__cxx11::string::~string(in_stack_fffffffffffffea0);
      uVar6 = (undefined7)((ulong)extraout_RAX >> 8);
      if ((in_stack_fffffffffffffeaf & 1) != 0) {
        local_1 = 1;
        goto LAB_001109c9;
      }
      pvVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               operator[](in_stack_fffffffffffffea0,(size_type)in_stack_fffffffffffffe98);
      if (*pvVar4 == '!') {
        bVar3 = true;
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffffebf,in_stack_fffffffffffffeb8),
                   (size_type)in_stack_fffffffffffffeb0,
                   CONCAT17(in_stack_fffffffffffffeaf,
                            CONCAT16(in_stack_fffffffffffffeae,
                                     CONCAT15(in_stack_fffffffffffffead,
                                              CONCAT14(in_stack_fffffffffffffeac,
                                                       in_stack_fffffffffffffea8)))));
        std::__cxx11::string::string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffee0._M_p,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffffedf,CONCAT16(bVar1,in_stack_fffffffffffffed8)));
        in_stack_fffffffffffffeae =
             search((text *)in_stack_fffffffffffffee0._M_p,
                    (text *)CONCAT17(in_stack_fffffffffffffedf,
                                     CONCAT16(bVar1,in_stack_fffffffffffffed8)));
        std::__cxx11::string::~string(in_stack_fffffffffffffea0);
        std::__cxx11::string::~string(in_stack_fffffffffffffea0);
        uVar6 = (undefined7)((ulong)extraout_RAX_00 >> 8);
        if ((in_stack_fffffffffffffeae & 1) != 0) {
          local_1 = 0;
          goto LAB_001109c9;
        }
      }
      else {
        bVar3 = false;
      }
      std::
      reverse_iterator<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::operator++((reverse_iterator<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    *)in_stack_fffffffffffffea0);
    }
    bVar7 = 0;
    uVar5 = 0;
    local_1 = 0;
    if (bVar3) {
      in_stack_fffffffffffffea0 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &stack0xfffffffffffffee0;
      std::__cxx11::string::string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffee0._M_p,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (ulong)CONCAT16(bVar1,in_stack_fffffffffffffed8));
      bVar7 = 1;
      bVar3 = hidden(in_stack_ffffffffffffff60);
      uVar5 = CONCAT71(extraout_var_02,bVar3) ^ 0xff;
      local_1 = (byte)uVar5;
    }
    uVar6 = (undefined7)(uVar5 >> 8);
    local_1 = local_1 & 1;
    if ((bVar7 & 1) != 0) {
      std::__cxx11::string::~string(in_stack_fffffffffffffea0);
      uVar6 = extraout_var_03;
    }
  }
  else {
    std::__cxx11::string::string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffee0._M_p,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffffedf,CONCAT16(bVar1,in_stack_fffffffffffffed8)));
    bVar3 = hidden(in_stack_ffffffffffffff60);
    local_1 = (bVar3 ^ 0xffU) & 1;
    std::__cxx11::string::~string(in_stack_fffffffffffffea0);
    uVar6 = extraout_var;
  }
LAB_001109c9:
  return (int)CONCAT71(uVar6,local_1);
}

Assistant:

inline bool select( text name, texts include )
{
    if ( none( include ) )
    {
        return ! hidden( name );
    }

    bool any = false;
    for ( texts::reverse_iterator pos = include.rbegin(); pos != include.rend(); ++pos )
    {
        text & part = *pos;

        if ( part == "@" || part == "*" )
            return true;

        if ( search( part, name ) )
            return true;

        if ( '!' == part[0] )
        {
            any = true;
            if ( search( part.substr(1), name ) )
                return false;
        }
        else
        {
            any = false;
        }
    }
    return any && ! hidden( name );
}